

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O2

return_type_conflict1 * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::and_then<____C_A_T_C_H____T_E_S_T____28()::__25&>
          (return_type_conflict1 *__return_storage_ptr__,
          impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
          *this,anon_class_1_0_00000001 *fn)

{
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar1;
  uint *puVar2;
  int i;
  _Variant_storage<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  
  if (this[0x20] ==
      (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
       )0x0) {
    puVar2 = (uint *)result_adapter<std::variant<int,std::__cxx11::string>>::
                     get_success<std::variant<int,std::__cxx11::string>>
                               ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this);
    ____C_A_T_C_H____T_E_S_T____28()::$_25::operator()[abi_cxx11_
              (__return_storage_ptr__,(void *)(ulong)*puVar2,i);
  }
  else {
    pvVar1 = result_adapter<std::variant<int,std::__cxx11::string>>::
             get_error<std::variant<int,std::__cxx11::string>>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    std::__detail::__variant::_Variant_storage<false,double,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string>
              ((_Variant_storage<false,double,std::__cxx11::string> *)&_Stack_38,pvVar1);
    std::__detail::__variant::
    _Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&_Stack_38);
    std::__detail::__variant::
    _Variant_storage<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&_Stack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) and_then(Fn&& fn) &&
      {
        return _impl::and_then(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }